

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O2

void ZmqContextManager::closeContext(string *contextName)

{
  iterator __position;
  
  CLI::std::mutex::lock((mutex *)&contextLock);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>_>
               ::find(&contexts_abi_cxx11_._M_t,contextName);
  if ((_Rb_tree_header *)__position._M_node !=
      &contexts_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>>
                        *)&contexts_abi_cxx11_,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&contextLock);
  return;
}

Assistant:

void ZmqContextManager::closeContext(const std::string& contextName)
{
    std::lock_guard<std::mutex> conlock(contextLock);
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        contexts.erase(fnd);
    }
}